

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void lj_record_tailcall(jit_State *J,BCReg func,ptrdiff_t nargs)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  TRef *pTVar4;
  
  uVar3 = (ulong)func;
  rec_call_setup(J,func,nargs);
  uVar2 = *(uint *)((long)J->L->base + -4);
  if ((uVar2 & 7) == 3) {
    iVar1 = J->framedepth;
    J->framedepth = iVar1 + -1;
    if (iVar1 < 1) {
      lj_trace_err(J,LJ_TRERR_NYIRETL);
    }
    uVar2 = (int)uVar2 >> 3;
    J->baseslot = J->baseslot - uVar2;
    pTVar4 = J->base + -(ulong)uVar2;
    J->base = pTVar4;
    uVar3 = (ulong)(uVar2 + func);
  }
  else {
    pTVar4 = J->base;
  }
  memmove(pTVar4 + -1,pTVar4 + uVar3,(ulong)(J->maxslot + 1) << 2);
  iVar1 = J->tailcalled;
  J->tailcalled = iVar1 + 1;
  if (iVar1 < J->loopunroll) {
    return;
  }
  lj_trace_err(J,LJ_TRERR_LUNROLL);
}

Assistant:

void lj_record_tailcall(jit_State *J, BCReg func, ptrdiff_t nargs)
{
  rec_call_setup(J, func, nargs);
  if (frame_isvarg(J->L->base - 1)) {
    BCReg cbase = (BCReg)frame_delta(J->L->base - 1);
    if (--J->framedepth < 0)
      lj_trace_err(J, LJ_TRERR_NYIRETL);
    J->baseslot -= (BCReg)cbase;
    J->base -= cbase;
    func += cbase;
  }
  /* Move func + args down. */
  if (LJ_FR2 && J->baseslot == 2)
    J->base[func+1] = TREF_FRAME;
  memmove(&J->base[-1-LJ_FR2], &J->base[func], sizeof(TRef)*(J->maxslot+1+LJ_FR2));
  /* Note: the new TREF_FRAME is now at J->base[-1] (even for slot #0). */
  /* Tailcalls can form a loop, so count towards the loop unroll limit. */
  if (++J->tailcalled > J->loopunroll)
    lj_trace_err(J, LJ_TRERR_LUNROLL);
}